

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PageAllocator.cpp
# Opt level: O0

bool __thiscall
Memory::HeapPageAllocator<Memory::VirtualAllocWrapper>::ReleaseSecondary
          (HeapPageAllocator<Memory::VirtualAllocWrapper> *this,SecondaryAllocation *allocation,
          void *segmentParam)

{
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  SecondaryAllocator *pSVar5;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *this_00;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *list;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *toList;
  DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount> *fromList;
  PageSegmentBase<Memory::VirtualAllocWrapper> *pageSegment;
  SegmentBase<Memory::VirtualAllocWrapper> *segment;
  void *segmentParam_local;
  SecondaryAllocation *allocation_local;
  HeapPageAllocator<Memory::VirtualAllocWrapper> *this_local;
  
  if (allocation->address == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xad0,"(allocation.address != nullptr)","allocation.address != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  pSVar5 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocator
                     ((SegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
  if (pSVar5 == (SecondaryAllocator *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                       ,0xad1,"(segment->GetSecondaryAllocator())",
                       "segment->GetSecondaryAllocator()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar4 = 0;
  }
  bVar2 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
          ::IsPageSegment(&this->
                           super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                          ,(SegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
  if (bVar2) {
    this_00 = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
              ::GetSegmentList(&this->
                                super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                               ,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    pSVar5 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocator
                       ((SegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    (*pSVar5->_vptr_SecondaryAllocator[1])(pSVar5,allocation);
    list = PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           ::GetSegmentList(&this->
                             super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                            ,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    if (this_00 != list) {
      uVar3 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetFreePageCount
                        ((PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
      Output::Trace(EmitterPhase,L"XDATA reclaimed pages:%u\n",(ulong)uVar3);
      DListBase<Memory::PageSegmentBase<Memory::VirtualAllocWrapper>,_RealCount>::MoveElementTo
                (this_00,(PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam,list);
      if (this_00 !=
          &(this->
           super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
           ).fullSegments) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0xae1,"(fromList == &this->fullSegments)",
                           "Releasing a secondary allocator should make a state change only if the segment was originally in the full list"
                          );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      bVar2 = SegmentBase<Memory::VirtualAllocWrapper>::CanAllocSecondary
                        ((SegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
      if (!bVar2) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                           ,0xae2,"(pageSegment->CanAllocSecondary())",
                           "It should be allocate secondary now");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar4 = 0;
      }
      uVar3 = PageSegmentBase<Memory::VirtualAllocWrapper>::GetFreePageCount
                        ((PageSegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
      PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
      ::AddFreePageCount(&this->
                          super_PageAllocatorBase<Memory::VirtualAllocWrapper,_Memory::SegmentBase<Memory::VirtualAllocWrapper>,_Memory::PageSegmentBase<Memory::VirtualAllocWrapper>_>
                         ,uVar3);
      return true;
    }
  }
  else {
    bVar2 = SegmentBase<Memory::VirtualAllocWrapper>::CanAllocSecondary
                      ((SegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    if (!bVar2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/PageAllocator.cpp"
                         ,0xae9,"(segment->CanAllocSecondary())","segment->CanAllocSecondary()");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar4 = 0;
    }
    pSVar5 = SegmentBase<Memory::VirtualAllocWrapper>::GetSecondaryAllocator
                       ((SegmentBase<Memory::VirtualAllocWrapper> *)segmentParam);
    (*pSVar5->_vptr_SecondaryAllocator[1])(pSVar5,allocation);
  }
  return false;
}

Assistant:

bool HeapPageAllocator<T>::ReleaseSecondary(const SecondaryAllocation& allocation, void* segmentParam)
{
    SegmentBase<T> * segment = (SegmentBase<T>*)segmentParam;
    Assert(allocation.address != nullptr);
    Assert(segment->GetSecondaryAllocator());

    if (this->IsPageSegment(segment))
    {
        PageSegmentBase<T>* pageSegment = static_cast<PageSegmentBase<T>*>(segment);
        auto fromList = this->GetSegmentList(pageSegment);

        pageSegment->GetSecondaryAllocator()->Release(allocation);

        auto toList = this->GetSegmentList(pageSegment);

        if (fromList != toList)
        {
            OUTPUT_TRACE(Js::EmitterPhase, _u("XDATA reclaimed pages:%u\n"), pageSegment->GetFreePageCount());
            fromList->MoveElementTo(pageSegment, toList);

            AssertMsg(fromList == &this->fullSegments, "Releasing a secondary allocator should make a state change only if the segment was originally in the full list");
            AssertMsg(pageSegment->CanAllocSecondary(), "It should be allocate secondary now");
            this->AddFreePageCount(pageSegment->GetFreePageCount());
            return true;
        }
    }
    else
    {
        Assert(segment->CanAllocSecondary());
        segment->GetSecondaryAllocator()->Release(allocation);
    }
    return false;
}